

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easylogging++.h
# Opt level: O0

void __thiscall
el::base::utils::RegistryWithPred<el::base::HitCounter,_el::base::HitCounter::Predicate>::
unregisterAll(RegistryWithPred<el::base::HitCounter,_el::base::HitCounter::Predicate> *this)

{
  bool bVar1;
  uint uVar2;
  int iVar3;
  undefined4 extraout_var;
  reference pointer;
  undefined4 extraout_var_00;
  HitCounter **curr;
  iterator __end0;
  iterator __begin0;
  vector<el::base::HitCounter_*,_std::allocator<el::base::HitCounter_*>_> *__range4;
  RegistryWithPred<el::base::HitCounter,_el::base::HitCounter::Predicate> *this_local;
  
  uVar2 = (*(this->
            super_AbstractRegistry<el::base::HitCounter,_std::vector<el::base::HitCounter_*,_std::allocator<el::base::HitCounter_*>_>_>
            ).super_ThreadSafe._vptr_ThreadSafe[9])();
  if ((uVar2 & 1) == 0) {
    iVar3 = (*(this->
              super_AbstractRegistry<el::base::HitCounter,_std::vector<el::base::HitCounter_*,_std::allocator<el::base::HitCounter_*>_>_>
              ).super_ThreadSafe._vptr_ThreadSafe[0xb])();
    __end0 = std::vector<el::base::HitCounter_*,_std::allocator<el::base::HitCounter_*>_>::begin
                       ((vector<el::base::HitCounter_*,_std::allocator<el::base::HitCounter_*>_> *)
                        CONCAT44(extraout_var,iVar3));
    curr = (HitCounter **)
           std::vector<el::base::HitCounter_*,_std::allocator<el::base::HitCounter_*>_>::end
                     ((vector<el::base::HitCounter_*,_std::allocator<el::base::HitCounter_*>_> *)
                      CONCAT44(extraout_var,iVar3));
    while( true ) {
      bVar1 = __gnu_cxx::operator!=
                        (&__end0,(__normal_iterator<el::base::HitCounter_**,_std::vector<el::base::HitCounter_*,_std::allocator<el::base::HitCounter_*>_>_>
                                  *)&curr);
      if (!bVar1) break;
      pointer = __gnu_cxx::
                __normal_iterator<el::base::HitCounter_**,_std::vector<el::base::HitCounter_*,_std::allocator<el::base::HitCounter_*>_>_>
                ::operator*(&__end0);
      safeDelete<el::base::HitCounter>(pointer);
      __gnu_cxx::
      __normal_iterator<el::base::HitCounter_**,_std::vector<el::base::HitCounter_*,_std::allocator<el::base::HitCounter_*>_>_>
      ::operator++(&__end0);
    }
    iVar3 = (*(this->
              super_AbstractRegistry<el::base::HitCounter,_std::vector<el::base::HitCounter_*,_std::allocator<el::base::HitCounter_*>_>_>
              ).super_ThreadSafe._vptr_ThreadSafe[0xb])();
    std::vector<el::base::HitCounter_*,_std::allocator<el::base::HitCounter_*>_>::clear
              ((vector<el::base::HitCounter_*,_std::allocator<el::base::HitCounter_*>_> *)
               CONCAT44(extraout_var_00,iVar3));
  }
  return;
}

Assistant:

virtual void unregisterAll(void) ELPP_FINAL {
    if (!this->empty()) {
      for (auto&& curr : this->list()) {
        base::utils::safeDelete(curr);
      }
      this->list().clear();
    }
  }